

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void __thiscall ImGuiMenuColumns::CalcNextTotalWidth(ImGuiMenuColumns *this,bool update_offsets)

{
  ImU16 IVar1;
  int i;
  int iVar2;
  long lVar3;
  ushort uVar4;
  ImU16 IVar5;
  bool bVar6;
  ImU16 IVar7;
  
  bVar6 = false;
  uVar4 = 0;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    IVar1 = this->Widths[lVar3];
    IVar5 = this->Spacing;
    if (IVar1 == 0) {
      IVar5 = 0;
    }
    IVar7 = 0;
    if (bVar6) {
      IVar7 = IVar5;
    }
    IVar7 = uVar4 + IVar7;
    if (update_offsets) {
      iVar2 = (int)lVar3;
      if (iVar2 == 3) {
        this->OffsetMark = IVar7;
      }
      else if (iVar2 == 2) {
        this->OffsetShortcut = IVar7;
      }
      else if (iVar2 == 1) {
        this->OffsetLabel = IVar7;
      }
    }
    bVar6 = (bool)(bVar6 | IVar1 != 0);
    uVar4 = IVar7 + IVar1;
  }
  this->NextTotalWidth = (uint)uVar4;
  return;
}

Assistant:

void ImGuiMenuColumns::CalcNextTotalWidth(bool update_offsets)
{
    ImU16 offset = 0;
    bool want_spacing = false;
    for (int i = 0; i < IM_ARRAYSIZE(Widths); i++)
    {
        ImU16 width = Widths[i];
        if (want_spacing && width > 0)
            offset += Spacing;
        want_spacing |= (width > 0);
        if (update_offsets)
        {
            if (i == 1) { OffsetLabel = offset; }
            if (i == 2) { OffsetShortcut = offset; }
            if (i == 3) { OffsetMark = offset; }
        }
        offset += width;
    }
    NextTotalWidth = offset;
}